

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O1

bool __thiscall Minisat::Solver::binResMinimize(Solver *this,vec<Minisat::Lit> *out_learnt)

{
  uint64_t *puVar1;
  Lit *pLVar2;
  unsigned_long *puVar3;
  vec<Minisat::Watcher> *pvVar4;
  Watcher *pWVar5;
  lbool *plVar6;
  unsigned_long uVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  
  this->counter = this->counter + 1;
  iVar8 = out_learnt->sz;
  if (1 < (long)iVar8) {
    pLVar2 = out_learnt->data;
    puVar3 = (this->seen2).data;
    lVar12 = 1;
    do {
      puVar3[pLVar2[lVar12].x >> 1] = this->counter;
      lVar12 = lVar12 + 1;
    } while (iVar8 != lVar12);
  }
  pLVar2 = out_learnt->data;
  iVar9 = pLVar2->x;
  pvVar4 = (this->watches_bin).occs.data;
  puVar1 = &(this->statistics).solveSteps;
  *puVar1 = *puVar1 + 1;
  uVar10 = (long)iVar9 ^ 1;
  lVar12 = (long)pvVar4[uVar10].sz;
  if (lVar12 < 1) {
    iVar9 = 0;
  }
  else {
    pWVar5 = pvVar4[uVar10].data;
    puVar3 = (this->seen2).data;
    plVar6 = (this->assigns).data;
    lVar11 = 0;
    iVar9 = 0;
    do {
      iVar13 = pWVar5[lVar11].blocker.x;
      iVar14 = iVar13 >> 1;
      if ((puVar3[iVar14] == this->counter) && (plVar6[iVar14].value == ((byte)iVar13 & 1))) {
        iVar9 = iVar9 + 1;
        puVar3[iVar14] = this->counter - 1;
      }
      lVar11 = lVar11 + 1;
    } while (lVar12 != lVar11);
  }
  if (0 < iVar9) {
    iVar13 = out_learnt->sz - iVar9;
    if (1 < iVar13) {
      iVar8 = iVar8 + -1;
      puVar3 = (this->seen2).data;
      uVar7 = this->counter;
      iVar14 = 1;
      do {
        iVar13 = iVar14;
        if (puVar3[pLVar2[iVar14].x >> 1] != uVar7) {
          lVar12 = (long)iVar8;
          iVar8 = iVar8 + -1;
          iVar13 = iVar14 + -1;
          pLVar2[iVar14].x = pLVar2[lVar12].x;
        }
        iVar14 = iVar13 + 1;
        iVar13 = out_learnt->sz - iVar9;
      } while (iVar14 < iVar13);
    }
    out_learnt->sz = iVar13;
  }
  return iVar9 != 0;
}

Assistant:

bool Solver::binResMinimize(vec<Lit> &out_learnt)
{
    // Preparation: remember which false variables we have in 'out_learnt'.
    counter++;
    for (int i = 1; i < out_learnt.size(); i++) seen2[var(out_learnt[i])] = counter;

    // Get the list of binary clauses containing 'out_learnt[0]'.
    const vec<Watcher> &ws = watches_bin[~out_learnt[0]];
    statistics.solveSteps++;

    int to_remove = 0;
    for (int i = 0; i < ws.size(); i++) {
        Lit the_other = ws[i].blocker;
        // Does 'the_other' appear negatively in 'out_learnt'?
        if (seen2[var(the_other)] == counter && value(the_other) == l_True) {
            to_remove++;
            seen2[var(the_other)] = counter - 1; // Remember to remove this variable.
        }
    }

    // Shrink.
    if (to_remove > 0) {
        int last = out_learnt.size() - 1;
        for (int i = 1; i < out_learnt.size() - to_remove; i++)
            if (seen2[var(out_learnt[i])] != counter) out_learnt[i--] = out_learnt[last--];
        out_learnt.shrink(to_remove);
    }
    return to_remove != 0;
}